

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorted_aggregate_function.cpp
# Opt level: O1

bool __thiscall
duckdb::SortedAggregateBindData::Equals(SortedAggregateBindData *this,FunctionData *other_p)

{
  _Head_base<0UL,_duckdb::FunctionData_*,_false> _Var1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  pointer pFVar5;
  type pFVar6;
  const_reference pvVar7;
  const_reference pvVar8;
  ulong __n;
  
  _Var1._M_head_impl =
       (this->bind_info).
       super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
       super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
       super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
  if (_Var1._M_head_impl != (FunctionData *)0x0) {
    if (other_p[0x2b]._vptr_FunctionData != (_func_int **)0x0) {
      pFVar5 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
               operator->(&this->bind_info);
      pFVar6 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
               operator*((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                          *)(other_p + 0x2b));
      iVar4 = (*pFVar5->_vptr_FunctionData[3])(pFVar5,pFVar6);
      if ((char)iVar4 == '\0') {
        return false;
      }
      goto LAB_012d379c;
    }
    if (_Var1._M_head_impl != (FunctionData *)0x0) {
      return false;
    }
  }
  if (other_p[0x2b]._vptr_FunctionData != (_func_int **)0x0) {
    return false;
  }
LAB_012d379c:
  bVar2 = AggregateFunction::operator==(&this->function,(AggregateFunction *)(other_p + 2));
  if ((!bVar2) ||
     ((long)(this->orders).
            super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
            super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)(this->orders).
            super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
            super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
            _M_impl.super__Vector_impl_data._M_start !=
      (long)other_p[0x30]._vptr_FunctionData - (long)other_p[0x2f]._vptr_FunctionData)) {
    return false;
  }
  bVar2 = (this->orders).
          super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
          super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          (this->orders).
          super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
          super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
          _M_impl.super__Vector_impl_data._M_start;
  if (bVar2) {
    return bVar2;
  }
  pvVar7 = vector<duckdb::BoundOrderByNode,_true>::operator[](&this->orders,0);
  pvVar8 = vector<duckdb::BoundOrderByNode,_true>::operator[]
                     ((vector<duckdb::BoundOrderByNode,_true> *)(other_p + 0x2f),0);
  bVar3 = BoundOrderByNode::Equals(pvVar7,pvVar8);
  if (bVar3) {
    __n = 1;
    do {
      bVar2 = (ulong)(((long)(this->orders).
                             super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                             .
                             super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->orders).
                             super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                             .
                             super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)
              <= __n;
      if (bVar2) {
        return bVar2;
      }
      pvVar7 = vector<duckdb::BoundOrderByNode,_true>::operator[](&this->orders,__n);
      pvVar8 = vector<duckdb::BoundOrderByNode,_true>::operator[]
                         ((vector<duckdb::BoundOrderByNode,_true> *)(other_p + 0x2f),__n);
      bVar3 = BoundOrderByNode::Equals(pvVar7,pvVar8);
      __n = __n + 1;
    } while (bVar3);
    return bVar2;
  }
  return bVar2;
}

Assistant:

bool Equals(const FunctionData &other_p) const override {
		auto &other = other_p.Cast<SortedAggregateBindData>();
		if (bind_info && other.bind_info) {
			if (!bind_info->Equals(*other.bind_info)) {
				return false;
			}
		} else if (bind_info || other.bind_info) {
			return false;
		}
		if (function != other.function) {
			return false;
		}
		if (orders.size() != other.orders.size()) {
			return false;
		}
		for (size_t i = 0; i < orders.size(); ++i) {
			if (!orders[i].Equals(other.orders[i])) {
				return false;
			}
		}
		return true;
	}